

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strFindLast_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar UVar5;
  long lVar6;
  UChar *t_1;
  int iVar7;
  long lVar8;
  
  if (subLength < -1 || sub == (UChar *)0x0) {
    return s;
  }
  if (-2 < length && s != (UChar *)0x0) {
    if (subLength < 0) {
      subLength = -1;
      pUVar2 = sub;
      do {
        subLength = subLength + 1;
        UVar1 = *pUVar2;
        pUVar2 = pUVar2 + 1;
      } while (UVar1 != L'\0');
    }
    if (subLength == 0) {
      return s;
    }
    lVar6 = (long)subLength;
    UVar1 = sub[lVar6 + -1];
    iVar7 = subLength + -1;
    if ((iVar7 == 0) && ((UVar1 & 0xf800U) != 0xd800)) {
      if (-1 < length) {
        pUVar2 = u_memrchr_63(s,UVar1,length);
        return pUVar2;
      }
      pUVar2 = u_strrchr_63(s,UVar1);
      return pUVar2;
    }
    if (length < 0) {
      length = -1;
      pUVar2 = s;
      do {
        length = length + 1;
        UVar5 = *pUVar2;
        pUVar2 = pUVar2 + 1;
      } while (UVar5 != L'\0');
    }
    if ((subLength <= length) && (iVar7 != length)) {
      pUVar2 = s + length;
      do {
        pUVar4 = pUVar2 + -1;
        if (pUVar2[-1] == UVar1) {
          pUVar3 = pUVar4;
          lVar8 = lVar6 * 2;
          UVar5 = UVar1;
          if (sub + lVar6 + -1 != sub) {
            do {
              UVar5 = pUVar3[-1];
              if (UVar5 != *(UChar *)((long)sub + lVar8 + -4)) goto LAB_0010eb76;
              pUVar3 = pUVar3 + -1;
              lVar8 = lVar8 + -2;
            } while (lVar8 != 2);
          }
          if (((pUVar3 == s) || ((UVar5 & 0xfc00U) != 0xdc00)) || ((pUVar3[-1] & 0xfc00U) != 0xd800)
             ) {
            if ((UVar1 & 0xfc00U) != 0xd800) {
              return pUVar3;
            }
            if (pUVar3 == s + length) {
              return pUVar3;
            }
            if ((*pUVar2 & 0xfc00U) != 0xdc00) {
              return pUVar3;
            }
          }
        }
LAB_0010eb76:
        pUVar2 = pUVar4;
        if (s + iVar7 == pUVar4) {
          return (UChar *)0x0;
        }
      } while( true );
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindLast(const UChar *s, int32_t length,
              const UChar *sub, int32_t subLength) {
    const UChar *start, *limit, *p, *q, *subLimit;
    UChar c, cs;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    /*
     * This implementation is more lazy than the one for u_strFindFirst():
     * There is no special search code for NUL-terminated strings.
     * It does not seem to be worth it for searching substrings to
     * search forward and find all matches like in u_strrchr() and similar.
     * Therefore, we simply get both string lengths and search backward.
     *
     * markus 2002oct23
     */

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[subLength-1] to search for it fast */
    subLimit=sub+subLength;
    cs=*(--subLimit);
    --subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strrchr(s, cs) : u_memrchr(s, cs, length);
    }

    if(length<0) {
        length=u_strlen(s);
    }

    /* subLength was decremented above */
    if(length<=subLength) {
        return NULL; /* s is shorter than sub */
    }

    start=s;
    limit=s+length;

    /* the substring must start no later than s+subLength */
    s+=subLength;

    while(s!=limit) {
        c=*(--limit);
        if(c==cs) {
            /* found last substring UChar, compare rest */
            p=limit;
            q=subLimit;
            for(;;) {
                if(q==sub) {
                    if(isMatchAtCPBoundary(start, p, limit+1, start+length)) {
                        return (UChar *)p; /* well-formed match */
                    } else {
                        break; /* no match because surrogate pair is split */
                    }
                }
                if(*(--p)!=*(--q)) {
                    break; /* no match */
                }
            }
        }
    }

    /* not found */
    return NULL;
}